

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall t_js_generator::close_generator(t_js_generator *this)

{
  ulong uVar1;
  int in_ESI;
  t_js_generator *this_local;
  
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_,in_ESI);
  if ((this->gen_ts_ & 1U) != 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      in_ESI = 0x4dc71b;
      std::operator<<((ostream *)&this->f_types_ts_,"}");
    }
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_types_ts_,in_ESI);
  }
  if ((this->gen_episode_file_ & 1U) != 0) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_episode_,in_ESI);
  }
  return;
}

Assistant:

void t_js_generator::close_generator() {
  // Close types file(s)

  f_types_.close();

  if (gen_ts_) {
    if (!ts_module_.empty()) {
      f_types_ts_ << "}";
    }
    f_types_ts_.close();
  }
  if (gen_episode_file_){
    f_episode_.close();
  }
}